

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O2

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  char cVar1;
  uint uVar2;
  uint i;
  uint uVar3;
  uint uVar4;
  pointer __p;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  __uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> _Var8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  _Head_base<0UL,_unsigned_int_*,_false> _Var13;
  uint local_198 [2];
  uint SmallBuffer [64];
  ArrayRef<char> FromArray_local;
  ArrayRef<char> ToArray_local;
  long local_58;
  size_type x;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> local_40;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> Allocated;
  
  SmallBuffer._248_8_ = FromArray.Data;
  FromArray_local.Data = (char *)FromArray.Length;
  local_40._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  FromArray_local.Length = (size_type)ToArray.Data;
  Allocated._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
       ToArray.Length;
  uVar9 = ToArray.Length + 1;
  if (uVar9 < 0x41) {
    __p = local_198;
  }
  else {
    __p = (pointer)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
    std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset(&local_40,__p);
  }
  for (uVar3 = 1;
      _Var8.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ = 0,
      _Var8.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._0_4_ = uVar3,
      (ulong)_Var8.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl <=
      (ulong)Allocated._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl; uVar3 = uVar3 + 1) {
    __p[(long)_Var8.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl] = uVar3;
  }
  uVar3 = MaxEditDistance + 1;
  pcVar6 = (char *)0x1;
  do {
    if ((char *)FromArray.Length < pcVar6) {
      uVar3 = __p[(long)Allocated._M_t.
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl];
      break;
    }
    *__p = (uint)pcVar6;
    _Var13._M_head_impl = (uint *)0x0;
    uVar9 = (ulong)pcVar6 & 0xffffffff;
    uVar12 = (ulong)(pcVar6 + -1) & 0xffffffff;
    local_58 = 1;
    while( true ) {
      uVar7 = (uint)uVar9;
      if (Allocated._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl ==
          (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
          _Var13._M_head_impl) break;
      uVar2 = __p[(long)_Var13._M_head_impl + 1];
      pcVar5 = ArrayRef<char>::operator[]
                         ((ArrayRef<char> *)(SmallBuffer + 0x3e),(size_t)(pcVar6 + -1));
      cVar1 = *pcVar5;
      pcVar5 = ArrayRef<char>::operator[]((ArrayRef<char> *)&FromArray_local.Length,local_58 - 1);
      if (AllowReplacements) {
        uVar10 = (uint)uVar12 + (uint)(cVar1 != *pcVar5);
        uVar4 = __p[_Var13._M_head_impl];
        if (__p[(long)_Var13._M_head_impl + 1] < __p[_Var13._M_head_impl]) {
          uVar4 = __p[(long)_Var13._M_head_impl + 1];
        }
        uVar11 = uVar4 + 1;
        if (uVar10 <= uVar4 + 1) {
          uVar11 = uVar10;
        }
      }
      else {
        uVar11 = (uint)uVar12;
        if (cVar1 != *pcVar5) {
          uVar11 = __p[_Var13._M_head_impl];
          if (__p[(long)_Var13._M_head_impl + 1] < __p[_Var13._M_head_impl]) {
            uVar11 = __p[(long)_Var13._M_head_impl + 1];
          }
          uVar11 = uVar11 + 1;
        }
      }
      if (uVar11 < uVar7) {
        uVar7 = uVar11;
      }
      uVar9 = (ulong)uVar7;
      __p[(long)_Var13._M_head_impl + 1] = uVar11;
      local_58 = local_58 + 1;
      _Var13._M_head_impl = _Var13._M_head_impl + 1;
      uVar12 = (ulong)uVar2;
    }
    pcVar6 = pcVar6 + 1;
  } while ((MaxEditDistance == 0) || (uVar7 <= MaxEditDistance));
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&local_40);
  return uVar3;
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}